

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# acecPolyn.c
# Opt level: O3

void Pln_ManStop(Pln_Man_t *p)

{
  Hsh_VecMan_t *pHVar1;
  Vec_Int_t *pVVar2;
  int *piVar3;
  Vec_Que_t *__ptr;
  Vec_Flt_t *__ptr_00;
  float *__ptr_01;
  
  pHVar1 = p->pHashC;
  pVVar2 = pHVar1->vTable;
  piVar3 = pVVar2->pArray;
  if (piVar3 != (int *)0x0) {
    free(piVar3);
  }
  free(pVVar2);
  pVVar2 = pHVar1->vData;
  piVar3 = pVVar2->pArray;
  if (piVar3 != (int *)0x0) {
    free(piVar3);
  }
  free(pVVar2);
  pVVar2 = pHVar1->vMap;
  piVar3 = pVVar2->pArray;
  if (piVar3 != (int *)0x0) {
    free(piVar3);
  }
  free(pVVar2);
  free(pHVar1);
  pHVar1 = p->pHashM;
  pVVar2 = pHVar1->vTable;
  piVar3 = pVVar2->pArray;
  if (piVar3 != (int *)0x0) {
    free(piVar3);
  }
  free(pVVar2);
  pVVar2 = pHVar1->vData;
  piVar3 = pVVar2->pArray;
  if (piVar3 != (int *)0x0) {
    free(piVar3);
  }
  free(pVVar2);
  pVVar2 = pHVar1->vMap;
  piVar3 = pVVar2->pArray;
  if (piVar3 != (int *)0x0) {
    free(piVar3);
  }
  free(pVVar2);
  free(pHVar1);
  __ptr = p->vQue;
  if (__ptr->pOrder != (int *)0x0) {
    free(__ptr->pOrder);
    __ptr->pOrder = (int *)0x0;
  }
  if (__ptr->pHeap != (int *)0x0) {
    free(__ptr->pHeap);
  }
  free(__ptr);
  __ptr_00 = p->vCounts;
  __ptr_01 = __ptr_00->pArray;
  if (__ptr_01 != (float *)0x0) {
    free(__ptr_01);
  }
  free(__ptr_00);
  pVVar2 = p->vCoefs;
  piVar3 = pVVar2->pArray;
  if (piVar3 != (int *)0x0) {
    free(piVar3);
  }
  free(pVVar2);
  pVVar2 = p->vTempC[0];
  piVar3 = pVVar2->pArray;
  if (piVar3 != (int *)0x0) {
    free(piVar3);
  }
  free(pVVar2);
  pVVar2 = p->vTempC[1];
  piVar3 = pVVar2->pArray;
  if (piVar3 != (int *)0x0) {
    free(piVar3);
  }
  free(pVVar2);
  pVVar2 = p->vTempM[0];
  piVar3 = pVVar2->pArray;
  if (piVar3 != (int *)0x0) {
    free(piVar3);
  }
  free(pVVar2);
  pVVar2 = p->vTempM[1];
  piVar3 = pVVar2->pArray;
  if (piVar3 != (int *)0x0) {
    free(piVar3);
  }
  free(pVVar2);
  pVVar2 = p->vTempM[2];
  piVar3 = pVVar2->pArray;
  if (piVar3 != (int *)0x0) {
    free(piVar3);
  }
  free(pVVar2);
  pVVar2 = p->vTempM[3];
  piVar3 = pVVar2->pArray;
  if (piVar3 != (int *)0x0) {
    free(piVar3);
  }
  free(pVVar2);
  pVVar2 = p->vOrder;
  piVar3 = pVVar2->pArray;
  if (piVar3 != (int *)0x0) {
    free(piVar3);
  }
  free(pVVar2);
  free(p);
  return;
}

Assistant:

void Pln_ManStop( Pln_Man_t * p )
{
    Hsh_VecManStop( p->pHashC );
    Hsh_VecManStop( p->pHashM );
    Vec_QueFree( p->vQue );
    Vec_FltFree( p->vCounts );
    Vec_IntFree( p->vCoefs );
    Vec_IntFree( p->vTempC[0] );
    Vec_IntFree( p->vTempC[1] );
    Vec_IntFree( p->vTempM[0] );
    Vec_IntFree( p->vTempM[1] );
    Vec_IntFree( p->vTempM[2] );
    Vec_IntFree( p->vTempM[3] );
    Vec_IntFree( p->vOrder );
    ABC_FREE( p );
}